

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_stream.c
# Opt level: O0

MPP_RET h265e_stream_write_se_with_log(H265eStream *s,RK_S32 val,char *name)

{
  byte bVar1;
  uint val_00;
  MPP_RET MVar2;
  uint local_28;
  int local_24;
  RK_S32 tmp;
  RK_S32 size;
  char *name_local;
  RK_S32 val_local;
  H265eStream *s_local;
  
  local_24 = 0;
  local_28 = val * -2 + 1;
  if ((int)local_28 < 0) {
    local_28 = val << 1;
  }
  val_00 = local_28;
  if (0xff < (int)local_28) {
    local_24 = 0x10;
    local_28 = (int)local_28 >> 8;
  }
  bVar1 = "\x01\x01\x03\x03\x05\x05\x05\x05\a\a\a\a\a\a\a\a\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
          [(int)local_28];
  if ((h265e_debug & 0x200) != 0) {
    _mpp_log_l(4,"h265e_stream","write SE bits name %s, val %d ",(char *)0x0,name,(ulong)val_00);
  }
  MVar2 = h265e_stream_write_with_log(s,val_00,(uint)bVar1 + local_24,name);
  return MVar2;
}

Assistant:

MPP_RET h265e_stream_write_se_with_log(H265eStream *s,
                                       RK_S32 val, char *name)
{
    RK_S32 size = 0;
    RK_S32 tmp = 1 - val * 2;
    if (tmp < 0)
        tmp = val * 2;

    val = tmp;
    if (tmp >= 0x100) {
        size = 16;
        tmp >>= 8;
    }
    size += ue_size_tab[tmp];

    h265e_dbg(H265E_DBG_HEADER,
              "write SE bits name %s, val %d ",
              name, val);

    return h265e_stream_write_with_log(s, val, size, name);;
}